

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall
H264StreamReader::deserializeSliceHeader
          (H264StreamReader *this,SliceUnit *slice,uint8_t *buff,uint8_t *sliceEnd)

{
  uint8_t *dstBuffer;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (int)sliceEnd - (int)buff;
  while( true ) {
    dstBuffer = (this->m_decodedSliceHeader).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar1 = (int)(this->m_decodedSliceHeader).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (int)dstBuffer;
    iVar4 = iVar1 + -8;
    iVar2 = iVar3;
    if (iVar4 < iVar3) {
      iVar2 = iVar4;
    }
    iVar1 = NALUnit::decodeNAL(buff,buff + iVar2,dstBuffer,(long)iVar1);
    iVar1 = SliceUnit::deserialize
                      (slice,dstBuffer,dstBuffer + iVar1,&this->m_spsMap,&this->m_ppsMap);
    if ((iVar1 != -10) || (iVar3 <= iVar4)) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_decodedSliceHeader,
               (size_type)
               ((this->m_decodedSliceHeader).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (1 - (long)(this->m_decodedSliceHeader).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start)));
  }
  return iVar1;
}

Assistant:

int H264StreamReader::deserializeSliceHeader(SliceUnit &slice, const uint8_t *buff, const uint8_t *sliceEnd)
{
    int nalRez, toDecode;
    const int maxHeaderSize = static_cast<int>(sliceEnd - buff);
    do
    {
        uint8_t *tmpBuffer = m_decodedSliceHeader.data();
        const int tmpBufferSize = static_cast<int>(m_decodedSliceHeader.size());
        toDecode = FFMIN(tmpBufferSize - 8, maxHeaderSize);
        const int decodedLen = SliceUnit::decodeNAL(buff, buff + toDecode, tmpBuffer, tmpBufferSize);
        nalRez = slice.deserialize(tmpBuffer, tmpBuffer + decodedLen, m_spsMap, m_ppsMap);
        if (nalRez == NOT_ENOUGH_BUFFER && toDecode < maxHeaderSize)
            m_decodedSliceHeader.resize(m_decodedSliceHeader.size() + 1);
    } while (nalRez == NOT_ENOUGH_BUFFER && toDecode < maxHeaderSize);

    return nalRez;
}